

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateUnaryOp(ExpressionEvalContext *ctx,ExprUnaryOp *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  ExpressionContext *pEVar4;
  TypeStruct *pTVar5;
  bool bVar6;
  int iVar7;
  _func_int **in_RAX;
  ExprPointerLiteral *expr;
  undefined4 extraout_var;
  ExprMemoryLiteral *expression_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExprBase *pEVar8;
  TypeRef *type;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  byte bVar9;
  _func_int **pp_Var10;
  char *msg;
  ExprBase *unaff_R12;
  ExprMemoryLiteral *memory;
  bool bVar11;
  undefined4 uVar12;
  uint uVar13;
  longlong result;
  _func_int **local_38;
  
  uVar13 = (ctx->stackFrames).count;
  if ((uVar13 != 0) && ((ctx->stackFrames).data[uVar13 - 1]->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar7);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar2;
    pEVar8->type = pTVar3;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6b40;
    return pEVar8;
  }
  if (ctx->instructionsLimit <= ctx->instruction) {
    Report(ctx,"ERROR: instruction limit reached");
    return (ExprBase *)0x0;
  }
  ctx->instruction = ctx->instruction + 1;
  local_38 = in_RAX;
  expression_00 = (ExprMemoryLiteral *)Evaluate(ctx,expression->value);
  if (expression_00 == (ExprMemoryLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
  pTVar3 = (expression_00->super_ExprBase).type;
  pEVar4 = ctx->ctx;
  if (pTVar3 == pEVar4->typeBool) {
    if ((expression_00->super_ExprBase).typeID == 3) {
      if (*(int *)&(expression->super_ExprBase).field_0x2c == 4) {
        iVar7 = (*pEVar4->allocator->_vptr_Allocator[2])(pEVar4->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
        bVar9 = (expression_00->super_ExprBase).field_0x29 ^ 1;
LAB_00259d1b:
        pSVar2 = (expression->super_ExprBase).source;
        pTVar3 = (expression->super_ExprBase).type;
        pEVar8->typeID = 3;
        pEVar8->source = pSVar2;
        pEVar8->type = pTVar3;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6360;
        pEVar8->field_0x29 = bVar9;
        unaff_R12 = CheckType(&expression->super_ExprBase,pEVar8);
        bVar6 = false;
      }
      else {
        bVar6 = true;
      }
    }
    else {
      bVar6 = true;
      if (((expression_00->super_ExprBase).typeID == 6) &&
         (*(int *)&(expression->super_ExprBase).field_0x2c == 4)) {
        iVar7 = (*pEVar4->allocator->_vptr_Allocator[2])(pEVar4->allocator,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_03,iVar7);
        bVar9 = expression_00->ptr == (ExprPointerLiteral *)0x0;
        goto LAB_00259d1b;
      }
    }
    if (!bVar6) {
      return unaff_R12;
    }
    goto LAB_00259f1b;
  }
  bVar6 = ExpressionContext::IsIntegerType(pEVar4,pTVar3);
  if (bVar6) {
    local_38 = (_func_int **)0x0;
    bVar6 = TryTakeLong((ExprBase *)expression_00,(longlong *)&local_38);
    if (bVar6) {
      switch(*(undefined4 *)&(expression->super_ExprBase).field_0x2c) {
      case 1:
        pAVar1 = ctx->ctx->allocator;
        iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
        pp_Var10 = local_38;
        break;
      case 2:
        pAVar1 = ctx->ctx->allocator;
        iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_07,iVar7);
        pp_Var10 = (_func_int **)-(long)local_38;
        break;
      case 3:
        pAVar1 = ctx->ctx->allocator;
        iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_05,iVar7);
        pp_Var10 = (_func_int **)~(ulong)local_38;
        break;
      case 4:
        pAVar1 = ctx->ctx->allocator;
        iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_06,iVar7);
        pp_Var10 = (_func_int **)(ulong)(local_38 == (_func_int **)0x0);
        break;
      default:
        __assert_fail("!\"unknown unary operation\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x57b,"ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)");
      }
      pSVar2 = (expression->super_ExprBase).source;
      pTVar3 = (expression->super_ExprBase).type;
      pEVar8->typeID = 6;
      pEVar8->source = pSVar2;
      pEVar8->type = pTVar3;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f63d0;
      pEVar8[1]._vptr_ExprBase = pp_Var10;
LAB_00259f04:
      unaff_R12 = CheckType(&expression->super_ExprBase,pEVar8);
    }
LAB_00259f12:
    if (bVar6 != false) {
      return unaff_R12;
    }
  }
  else {
    bVar6 = ExpressionContext::IsFloatingPointType(ctx->ctx,(expression_00->super_ExprBase).type);
    if (bVar6) {
      local_38 = (_func_int **)0x0;
      bVar6 = TryTakeDouble((ExprBase *)expression_00,(double *)&local_38);
      if (bVar6) {
        iVar7 = *(int *)&(expression->super_ExprBase).field_0x2c;
        if (1 < iVar7 - 3U) {
          if (iVar7 == 2) {
            pAVar1 = ctx->ctx->allocator;
            iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
            pEVar8 = (ExprBase *)CONCAT44(extraout_var_08,iVar7);
            uVar12 = SUB84(local_38,0);
            uVar13 = (uint)((ulong)local_38 >> 0x20) ^ 0x80000000;
          }
          else {
            if (iVar7 != 1) {
              __assert_fail("!\"unknown unary operation\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x58f,
                            "ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)");
            }
            pAVar1 = ctx->ctx->allocator;
            iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x38);
            pEVar8 = (ExprBase *)CONCAT44(extraout_var_02,iVar7);
            uVar12 = SUB84(local_38,0);
            uVar13 = (uint)((ulong)local_38 >> 0x20);
          }
          pSVar2 = (expression->super_ExprBase).source;
          pTVar3 = (expression->super_ExprBase).type;
          pEVar8->typeID = 7;
          pEVar8->source = pSVar2;
          pEVar8->type = pTVar3;
          pEVar8->next = (ExprBase *)0x0;
          pEVar8->listed = false;
          pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6408;
          pEVar8[1]._vptr_ExprBase = (_func_int **)CONCAT44(uVar13,uVar12);
          goto LAB_00259f04;
        }
        unaff_R12 = (ExprBase *)0x0;
      }
      goto LAB_00259f12;
    }
    pTVar5 = (TypeStruct *)(expression_00->super_ExprBase).type;
    if ((pTVar5 == (TypeStruct *)0x0) || ((pTVar5->super_TypeBase).typeID != 0x12)) {
      pEVar4 = ctx->ctx;
      if (pTVar5 == pEVar4->typeAutoRef) {
        memory = (ExprMemoryLiteral *)0x0;
        if ((expression_00->super_ExprBase).typeID == 0xd) {
          memory = expression_00;
        }
        type = ExpressionContext::GetReferenceType(pEVar4,pEVar4->typeVoid);
        pEVar8 = CreateExtract(ctx,memory,4,&type->super_TypeBase);
        if (pEVar8 == (ExprBase *)0x0) {
LAB_00259e50:
          pEVar8 = (ExprBase *)0x0;
LAB_00259e52:
          bVar6 = pEVar8 != (ExprBase *)0x0;
          if (bVar6) {
            bVar11 = pEVar8[1]._vptr_ExprBase == (_func_int **)0x0;
            goto LAB_00259f8a;
          }
          bVar11 = true;
        }
        else {
          if (pEVar8->typeID != 9) {
            if (pEVar8->typeID != 0xc) goto LAB_00259e50;
            goto LAB_00259e52;
          }
          bVar11 = true;
LAB_00259f8a:
          bVar6 = true;
        }
        if (bVar6) {
          pAVar1 = ctx->ctx->allocator;
          iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
          pEVar8 = (ExprBase *)CONCAT44(extraout_var_09,iVar7);
          pSVar2 = (expression->super_ExprBase).source;
          pTVar3 = ctx->ctx->typeBool;
          pEVar8->typeID = 3;
          pEVar8->source = pSVar2;
          pEVar8->type = pTVar3;
          pEVar8->next = (ExprBase *)0x0;
          pEVar8->listed = false;
          pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6360;
          pEVar8->field_0x29 = bVar11;
          pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
          return pEVar8;
        }
        msg = "ERROR: failed to evaluate auto ref value";
        goto LAB_00259f22;
      }
    }
    else {
      bVar6 = true;
      if ((expression_00->super_ExprBase).typeID != 9) {
        if ((expression_00->super_ExprBase).typeID != 0xc) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x59c,"ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)");
        }
        bVar6 = expression_00->ptr == (ExprPointerLiteral *)0x0;
      }
      if (*(int *)&(expression->super_ExprBase).field_0x2c == 4) {
        pAVar1 = ctx->ctx->allocator;
        iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
        pEVar8 = (ExprBase *)CONCAT44(extraout_var_04,iVar7);
        pSVar2 = (expression->super_ExprBase).source;
        pTVar3 = ctx->ctx->typeBool;
        pEVar8->typeID = 3;
        pEVar8->source = pSVar2;
        pEVar8->type = pTVar3;
        pEVar8->next = (ExprBase *)0x0;
        pEVar8->listed = false;
        pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6360;
        pEVar8->field_0x29 = bVar6;
        pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
        return pEVar8;
      }
    }
  }
LAB_00259f1b:
  msg = "ERROR: failed to eval unary op";
LAB_00259f22:
  Report(ctx,msg);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateUnaryOp(ExpressionEvalContext &ctx, ExprUnaryOp *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(value->type == ctx.ctx.typeBool)
	{
		if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(value))
		{
			if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
				return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, !expr->value));
		}
		else if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(value))
		{
			if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
				return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, !expr->value));
		}
	}
	else if(ctx.ctx.IsIntegerType(value->type))
	{
		long long result = 0;

		if(TryTakeLong(value, result))
		{
			switch(expression->op)
			{
			case SYN_UNARY_OP_PLUS:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, result));
			case SYN_UNARY_OP_NEGATE:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, -result));
			case SYN_UNARY_OP_BIT_NOT:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, ~result));
			case SYN_UNARY_OP_LOGICAL_NOT:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, !result));
			default:
				assert(!"unknown unary operation");
			}
		}
	}
	else if(ctx.ctx.IsFloatingPointType(value->type))
	{
		double result = 0.0;

		if(TryTakeDouble(value, result))
		{
			switch(expression->op)
			{
			case SYN_UNARY_OP_PLUS:
				return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, expression->type, result));
			case SYN_UNARY_OP_NEGATE:
				return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, expression->type, -result));
			case SYN_UNARY_OP_BIT_NOT:
			case SYN_UNARY_OP_LOGICAL_NOT:
				return NULL;
			default:
				assert(!"unknown unary operation");
			}
		}
	}
	else if(isType<TypeRef>(value->type))
	{
		void *lPtr = NULL;

		if(isType<ExprNullptrLiteral>(value))
			lPtr = NULL;
		else if(ExprPointerLiteral *tmp = getType<ExprPointerLiteral>(value))
			lPtr = tmp->ptr;
		else
			assert(!"unknown type");

		if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !lPtr));
	}
	else if(value->type == ctx.ctx.typeAutoRef)
	{
		ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

		void *lPtr = 0;
		if(!TryTakePointer(CreateExtract(ctx, memLiteral, 4, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid)), lPtr))
			return Report(ctx, "ERROR: failed to evaluate auto ref value");

		return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !lPtr));

	}

	return Report(ctx, "ERROR: failed to eval unary op");
}